

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O2

void __thiscall Assimp::LWOImporter::ResolveTags(LWOImporter *this)

{
  pointer pbVar1;
  pointer pSVar2;
  int iVar3;
  uint i;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  value_type_conflict3 local_2c;
  
  local_2c = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (this->mMapping,
             (long)(this->mTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mTags->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,&local_2c);
  uVar5 = 0;
  do {
    uVar6 = (ulong)uVar5;
    pbVar1 = (this->mTags->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->mTags->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) <= uVar6) {
      return;
    }
    uVar4 = 0;
    while( true ) {
      pSVar2 = (this->mSurfaces->
               super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->mSurfaces->
                         super__Vector_base<Assimp::LWO::Surface,_std::allocator<Assimp::LWO::Surface>_>
                         )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2) / 0x148) <=
          uVar4) break;
      iVar3 = ASSIMP_stricmp(pbVar1 + uVar6,&pSVar2[uVar4].mName);
      if (iVar3 == 0) {
        (this->mMapping->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar6] = (uint)uVar4;
        break;
      }
      uVar4 = (ulong)((uint)uVar4 + 1);
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void LWOImporter::ResolveTags()
{
    // --- this function is used for both LWO2 and LWOB
    mMapping->resize(mTags->size(), UINT_MAX);
    for (unsigned int a = 0; a  < mTags->size();++a)    {

        const std::string& c = (*mTags)[a];
        for (unsigned int i = 0; i < mSurfaces->size();++i) {

            const std::string& d = (*mSurfaces)[i].mName;
            if (!ASSIMP_stricmp(c,d))   {

                (*mMapping)[a] = i;
                break;
            }
        }
    }
}